

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obme.cpp
# Opt level: O0

char * obme::OBME_D(char *data,int length)

{
  char cVar1;
  int in_ESI;
  char *in_RDI;
  
  while (1 < in_ESI) {
    in_ESI = in_ESI + -1;
    cVar1 = OBME<char>((char)((uint)in_ESI >> 0x18));
    in_RDI[in_ESI] = cVar1;
  }
  return in_RDI;
}

Assistant:

char* OBME_D(char *data, int length)
	{
		while(length > 1) {
			--length;
			data[length] = OBME(data[length]);
		}
		return data;
	}